

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O3

void __thiscall
Triangle::Triangle(Triangle *this,vec3f v1,vec3f v2,vec3f v3,vec2f vt1,vec2f vt2,vec2f vt3,vec3f vn1
                  ,vec3f vn2,vec3f vn3)

{
  undefined1 auVar1 [16];
  float (*pafVar2) [3];
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float local_70 [3];
  undefined8 local_64;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  mat3f res;
  
  local_54 = v1.z;
  (this->super_BasicPrimitive).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_0016a398;
  (this->v1).x = (float)(int)v1._0_8_;
  (this->v1).y = (float)(int)((ulong)v1._0_8_ >> 0x20);
  (this->v1).z = local_54;
  (this->v2).x = (float)(int)v2._0_8_;
  (this->v2).y = (float)(int)((ulong)v2._0_8_ >> 0x20);
  (this->v2).z = v2.z;
  (this->v3).x = (float)(int)v3._0_8_;
  (this->v3).y = (float)(int)((ulong)v3._0_8_ >> 0x20);
  (this->v3).z = v3.z;
  (this->vn1).z = vn1.z;
  (this->vn1).x = (float)(int)vn1._0_8_;
  (this->vn1).y = (float)(int)((ulong)vn1._0_8_ >> 0x20);
  (this->vn2).x = vn2.x;
  (this->vn2).y = vn2.y;
  (this->vn2).z = vn2.z;
  (this->vn3).x = vn3.x;
  (this->vn3).y = vn3.y;
  (this->vn3).z = vn3.z;
  auVar1._8_4_ = vt2.x;
  auVar1._0_8_ = vt1;
  auVar1._12_4_ = vt2.y;
  this->vt1 = vt1;
  (this->vt2).x = (float)(int)auVar1._8_8_;
  (this->vt2).y = (float)(int)((ulong)auVar1._8_8_ >> 0x20);
  this->vt3 = vt3;
  local_70[0] = v2.x - v1.x;
  local_58 = v2.z - local_54;
  local_70[1] = v3.x - v1.x;
  fVar13 = v2.y - v1.y;
  fVar14 = v3.y - v1.y;
  local_54 = v3.z - local_54;
  fVar16 = fVar13 * local_54 - fVar14 * local_58;
  fVar17 = local_58 * local_70[1] - local_54 * local_70[0];
  fVar15 = local_70[0] * fVar14 - local_70[1] * fVar13;
  fVar12 = 1.0 / SQRT(fVar15 * fVar15 + fVar16 * fVar16 + fVar17 * fVar17);
  fVar16 = fVar16 * fVar12;
  fVar17 = fVar17 * fVar12;
  fVar12 = fVar12 * fVar15;
  *(float *)((long)((this->tMatrix).data + 0) + 0) = 0.0;
  *(float *)((long)((this->tMatrix).data + 0) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[0] + 2) = 0;
  pafVar2 = (this->tMatrix).data;
  *(float *)((long)(pafVar2 + 1) + 4) = 0.0;
  *(float *)((long)(pafVar2 + 1) + 8) = 0.0;
  *(float *)((long)((this->tMatrix).data + 2) + 0) = 0.0;
  *(float *)((long)((this->tMatrix).data + 2) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[2] + 2) = 0;
  (this->planeNormal).x = fVar16;
  (this->planeNormal).y = fVar17;
  (this->planeNormal).z = fVar12;
  if (vn1.z * fVar12 + vn1.x * fVar16 + vn1.y * fVar17 < 0.0) {
    (this->planeNormal).x = -fVar16;
    (this->planeNormal).y = -fVar17;
    (this->planeNormal).z = -fVar12;
  }
  fVar16 = fVar14 * local_58 - fVar13 * local_54;
  fVar15 = local_54 * local_70[0] - local_58 * local_70[1];
  fVar12 = local_70[1] * fVar13 - local_70[0] * fVar14;
  this->one_by_2S = 1.0 / SQRT(fVar12 * fVar12 + fVar16 * fVar16 + fVar15 * fVar15);
  fVar12 = 1.0 / SQRT(local_54 * local_54 + local_70[1] * local_70[1] + fVar14 * fVar14);
  local_70[2] = fVar13 * fVar12 * local_54 + -local_58 * fVar14 * fVar12;
  local_5c = local_58 * local_70[1] * fVar12 + fVar12 * local_54 * -local_70[0];
  local_50 = fVar14 * fVar12 * local_70[0] + local_70[1] * fVar12 * -fVar13;
  local_64 = CONCAT44(fVar14,fVar13);
  puVar3 = &local_48;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  res.data[0][0] = 0.0;
  lVar4 = 0;
  do {
    lVar5 = lVar4 + 1;
    lVar6 = lVar5;
    if (lVar5 == 3) {
      lVar6 = 0;
    }
    uVar7 = ((int)lVar4 + 2U) % 3;
    uVar8 = 0xffffffff;
    lVar4 = 1;
    lVar10 = 0;
    do {
      lVar11 = 0;
      if (lVar10 != 0x18) {
        lVar11 = lVar4;
      }
      uVar9 = (ulong)uVar8;
      if (lVar10 == 0) {
        uVar9 = 2;
      }
      *(float *)((long)puVar3 + lVar10) =
           (local_70[lVar6 * 3 + lVar11] * local_70[(ulong)uVar7 * 3 + uVar9] -
           local_70[lVar6 * 3 + uVar9] * local_70[(ulong)uVar7 * 3 + lVar11]) *
           (1.0 / (((local_5c * -local_70[0] * local_54 +
                    fVar13 * local_70[2] * local_54 +
                    local_70[0] * fVar14 * local_50 + local_70[1] * local_5c * local_58) -
                   local_50 * local_70[1] * fVar13) - local_70[2] * fVar14 * local_58));
      lVar10 = lVar10 + 0xc;
      uVar8 = uVar8 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar10 != 0x24);
    puVar3 = (undefined8 *)((long)puVar3 + 4);
    lVar4 = lVar5;
  } while (lVar5 != 3);
  (this->tMatrix).data[2][2] = res.data[0][0];
  *(undefined8 *)((this->tMatrix).data[1] + 1) = local_38;
  *(undefined8 *)(this->tMatrix).data[2] = uStack_30;
  *(undefined8 *)(this->tMatrix).data[0] = local_48;
  *(undefined8 *)((this->tMatrix).data[0] + 2) = uStack_40;
  return;
}

Assistant:

Triangle(vec3f v1, vec3f v2, vec3f v3, vec2f vt1, vec2f vt2, vec2f vt3, vec3f vn1, vec3f vn2, vec3f vn3):
		v1(v1), v2(v2), v3(v3), vn1(vn1), vn2(vn2), vn3(vn3), vt1(vt1), vt2(vt2), vt3(vt3)
	// pre-calculation to accelerate intersection / interpolation computation
	{
		// NOTE: be careful when dealing with tiny triangles!
		assert(norm(v1-v2)>0);
		assert(norm(v1-v3)>0);
		assert(norm(v2-v3)>0);
		assert(norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9);

		planeNormal = normalized(cross(v2-v1, v3-v1));
		// make sure plane normal points outward
		if (dot(planeNormal, vn1) < 0)
			planeNormal *= -1;
		one_by_2S = 1 / norm(cross(v3-v1, v2-v1));
		tMatrix = inverse(mat3f(v2-v1, v3-v1, cross(v2-v1, normalized(v3-v1))));
	}